

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputTokenizer.h
# Opt level: O3

void __thiscall InputTokenizer::Lexeme::~Lexeme(Lexeme *this)

{
  pointer pcVar1;
  
  this->_vptr_Lexeme = (_func_int **)&PTR__Lexeme_0012aa08;
  pcVar1 = (this->token)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->token).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~Lexeme() {}